

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_private.h
# Opt level: O0

uint64_t amqp_d64(void *data)

{
  int iVar1;
  ulong *in_RDI;
  uint64_t val;
  undefined8 local_10;
  
  local_10 = *in_RDI;
  iVar1 = is_bigendian();
  if (iVar1 == 0) {
    local_10 = local_10 >> 0x38 | (local_10 & 0xff000000000000) >> 0x28 |
               (local_10 & 0xff0000000000) >> 0x18 | (local_10 & 0xff00000000) >> 8 |
               (local_10 & 0xff000000) << 8 | (local_10 & 0xff0000) << 0x18 |
               (local_10 & 0xff00) << 0x28 | local_10 << 0x38;
  }
  return local_10;
}

Assistant:

static inline uint64_t amqp_d64(void *data) {
  uint64_t val;
  memcpy(&val, data, sizeof(val));
  if (!is_bigendian()) {
    val = ((val & 0xFF00000000000000u) >> 56u) |
          ((val & 0x00FF000000000000u) >> 40u) |
          ((val & 0x0000FF0000000000u) >> 24u) |
          ((val & 0x000000FF00000000u) >> 8u) |
          ((val & 0x00000000FF000000u) << 8u) |
          ((val & 0x0000000000FF0000u) << 24u) |
          ((val & 0x000000000000FF00u) << 40u) |
          ((val & 0x00000000000000FFu) << 56u);
  }
  return val;
}